

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [11],StringTree *params_1,
          char (*params_2) [3])

{
  char (*value) [11];
  StringTree *pSVar1;
  char (*value_00) [3];
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Branch *local_28;
  char (*params_local_2) [3];
  StringTree *params_local_1;
  char (*params_local) [11];
  
  local_28 = (Branch *)params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (StringTree *)this;
  params_local = (char (*) [11])__return_storage_ptr__;
  value = ::const((char (*) [11])this);
  local_38 = toCharSequence<char_const(&)[11]>(value);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pSVar1 = toCharSequence<kj::StringTree>(pSVar1);
  value_00 = ::const((char (*) [3])local_28);
  local_48 = toCharSequence<char_const(&)[3]>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)pSVar1,
             (StringTree *)&local_48,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}